

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O0

void __thiscall libtorrent::file_error_alert::~file_error_alert(file_error_alert *this)

{
  file_error_alert *this_local;
  
  ~file_error_alert(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

struct TORRENT_EXPORT file_error_alert final : torrent_alert
	{
		// internal
		file_error_alert(aux::stack_allocator& alloc, error_code const& ec
			, string_view file, operation_t op, torrent_handle const& h);

		TORRENT_DEFINE_ALERT_PRIO(file_error_alert, 43, alert_priority_high)

		static constexpr alert_category_t static_category = alert_category::status
			| alert_category::error
			| alert_category::storage;
		std::string message() const override;

		// the error code describing the error.
		error_code const error;

		// indicates which underlying operation caused the error
		operation_t op;

		// the file that experienced the error
		char const* filename() const;

	private:
		aux::allocation_slot m_file_idx;
#if TORRENT_ABI_VERSION == 1
	public:
		char const* TORRENT_DEPRECATED_MEMBER operation;
		// the path to the file that was accessed when the error occurred.
		std::string TORRENT_DEPRECATED_MEMBER file;
		std::string TORRENT_DEPRECATED_MEMBER msg;
#endif
	}